

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.c
# Opt level: O0

void prefixes_use_segment(_iflags defaultSeg,_PrefixState *ps,_DecodeType dt,_DInst *di)

{
  uint8_t uVar1;
  uint uVar2;
  _iflags flags;
  _DInst *di_local;
  _DecodeType dt_local;
  _PrefixState *ps_local;
  _iflags defaultSeg_local;
  
  if (dt == Decode64Bits) {
    if ((ps->decodedPrefixes & 0x1800) != 0) {
      uVar1 = 'H';
      if ((ps->decodedPrefixes & 0x1000) != 0) {
        uVar1 = 'I';
      }
      di->segment = uVar1;
    }
  }
  else {
    uVar2 = ps->decodedPrefixes & 0x1f80;
    if ((uVar2 == 0) || (uVar2 == defaultSeg)) {
      if (defaultSeg == 0x100) {
        di->segment = 0xc6;
      }
      else {
        di->segment = 199;
      }
    }
    else {
      ps->usedPrefixes = ps->usedPrefixes | uVar2;
      switch(uVar2 >> 7) {
      case 1:
        di->segment = 'E';
        break;
      case 2:
        di->segment = 'F';
        break;
      case 4:
        di->segment = 'G';
        break;
      case 8:
        di->segment = 'D';
        break;
      case 0x10:
        di->segment = 'H';
        break;
      case 0x20:
        di->segment = 'I';
      }
    }
  }
  return;
}

Assistant:

void prefixes_use_segment(_iflags defaultSeg, _PrefixState* ps, _DecodeType dt, _DInst* di)
{
	/* Extract given segment prefix from the decoded prefixes. */
	_iflags flags;

	if (dt == Decode64Bits) {
		if (ps->decodedPrefixes & INST_PRE_SEGOVRD_MASK64) { /* Either GS or FS. */
			di->segment = ps->decodedPrefixes & INST_PRE_GS ? R_GS : R_FS;
		}

		return;
	}

	flags = ps->decodedPrefixes & INST_PRE_SEGOVRD_MASK;

	/* Use the given prefix only if it's not the default. */
	if (flags && (flags != defaultSeg)) {
		ps->usedPrefixes |= flags;

		switch (flags >> 7) /* INST_PRE_CS is 1 << 7. And the rest of the prefixes follow as bit fields. */
		{
			case 1: di->segment = R_CS; break;
			case 2: di->segment = R_SS; break;
			case 4: di->segment = R_DS; break;
			case 8: di->segment = R_ES; break;
			case 0x10: di->segment = R_FS; break;
			case 0x20: di->segment = R_GS; break;
		}
	}
	else {
		if (defaultSeg == INST_PRE_SS) di->segment = SEGMENT_DEFAULT | R_SS;
		else di->segment = SEGMENT_DEFAULT | R_DS;
	}
}